

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  ushort uVar1;
  uint64_t *puVar2;
  long *plVar3;
  ulong uVar4;
  uint local_c8;
  CTSize sz;
  CType *ct;
  GCobj *root;
  GCcdata *cd_local;
  global_State *g_local;
  CType *ct_1;
  
  if ((cd->marked & 0x10) == 0) {
    if ((cd->marked & 0x80) == 0) {
      plVar3 = (long *)(g->ctype_state).ptr64;
      for (g_local = (global_State *)(*plVar3 + (ulong)cd->ctypeid * 0x18);
          *(uint *)&g_local->allocf >> 0x1c == 8;
          g_local = (global_State *)(*plVar3 + (ulong)(*(uint *)&g_local->allocf & 0xffff) * 0x18))
      {
      }
      if (*(uint *)&g_local->allocf >> 0x1c < 6) {
        local_c8 = *(uint *)((long)&g_local->allocf + 4);
      }
      else {
        local_c8 = 8;
      }
      (g->gc).total = (g->gc).total - ((ulong)local_c8 + 0x10);
      (*g->allocf)(g->allocd,cd,(ulong)local_c8 + 0x10,0);
    }
    else {
      uVar1._0_1_ = cd[-1].marked;
      uVar1._1_1_ = cd[-1].gct;
      uVar4 = (ulong)(*(int *)&cd[-1].field_0xc + (uint)cd[-1].ctypeid);
      (g->gc).total = (g->gc).total - uVar4;
      (*g->allocf)(g->allocd,(void *)((long)cd - (long)(int)(uint)uVar1),uVar4,0);
    }
  }
  else {
    cd->marked = cd->marked & 0xf8 | (g->gc).currentwhite & 3;
    cd->marked = cd->marked | 8;
    puVar2 = (uint64_t *)(g->gc).mmudata.gcptr64;
    if (puVar2 == (uint64_t *)0x0) {
      (cd->nextgc).gcptr64 = (uint64_t)cd;
      (g->gc).mmudata.gcptr64 = (uint64_t)cd;
    }
    else {
      (cd->nextgc).gcptr64 = *puVar2;
      *puVar2 = (uint64_t)cd;
      (g->gc).mmudata.gcptr64 = (uint64_t)cd;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
  }
}